

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int moveToLeftmost(BtCursor *pCur)

{
  long in_RDI;
  bool bVar1;
  MemPage *pPage;
  int rc;
  Pgno pgno;
  BtCursor *in_stack_ffffffffffffffd8;
  undefined1 *local_18;
  int local_10;
  
  local_10 = 0;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  while( true ) {
    bVar1 = false;
    if (local_10 == 0) {
      local_18 = *(undefined1 **)(in_RDI + 0x88);
      bVar1 = local_18[8] == '\0';
    }
    if (!bVar1) break;
    sqlite3Get4byte((u8 *)(*(long *)(local_18 + 0x50) +
                          (long)(int)(uint)(*(ushort *)(local_18 + 0x1a) &
                                           CONCAT11(*(undefined1 *)
                                                     (*(long *)(local_18 + 0x60) +
                                                     (long)(int)((uint)*(ushort *)(in_RDI + 0x56) <<
                                                                1)),
                                                    *(undefined1 *)
                                                     (*(long *)(local_18 + 0x60) + 1 +
                                                     (long)(int)((uint)*(ushort *)(in_RDI + 0x56) <<
                                                                1))))));
    local_10 = moveToChild(in_stack_ffffffffffffffd8,0);
  }
  return local_10;
}

Assistant:

static int moveToLeftmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( rc==SQLITE_OK && !(pPage = pCur->pPage)->leaf ){
    assert( pCur->ix<pPage->nCell );
    pgno = get4byte(findCell(pPage, pCur->ix));
    rc = moveToChild(pCur, pgno);
  }
  return rc;
}